

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall LLVMBC::StoreInst::StoreInst(StoreInst *this,Value *ptr,Value *value)

{
  Type *pTVar1;
  LLVMContext *context;
  Value *local_48;
  Value *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pTVar1 = Value::getType(ptr);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getVoidTy(context);
  Instruction::Instruction(&this->super_Instruction,pTVar1,Store);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_48 = value;
  local_40 = ptr;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38,
             &local_48);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_38);
  return;
}

Assistant:

StoreInst::StoreInst(Value *ptr, Value *value)
    : Instruction(Type::getVoidTy(ptr->getType()->getContext()), ValueKind::Store)
{
	set_operands({ value, ptr });
}